

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void TestFunctional(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test Functional");
  std::endl<char,std::char_traits<char>>(poVar1);
  FunctionalTester<short,_void>::Test();
  FunctionalTester<unsigned_short,_void>::Test();
  FunctionalTester<int,_void>::Test();
  FunctionalTester<unsigned_int,_void>::Test();
  FunctionalTester<long,_void>::Test();
  FunctionalTester<unsigned_long,_void>::Test();
  FunctionalTester<long_long,_void>::Test();
  FunctionalTester<unsigned_long_long,_void>::Test();
  return;
}

Assistant:

void TestFunctional()
{
    std::cout << "Test Functional" << std::endl;
    FunctionalTester<short>::Test();
    FunctionalTester<unsigned short>::Test();
    FunctionalTester<int>::Test();
    FunctionalTester<unsigned int>::Test();
    FunctionalTester<long>::Test();
    FunctionalTester<unsigned long>::Test();
    FunctionalTester<long long>::Test();
    FunctionalTester<unsigned long long>::Test();
}